

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O0

void __thiscall
TPZPrInteg<TPZInt1Point>::Point(TPZPrInteg<TPZInt1Point> *this,int ip,TPZVec<double> *pos,REAL *w)

{
  double *pdVar1;
  double *in_RCX;
  TPZVec<double> *in_RDX;
  int in_ESI;
  long in_RDI;
  unkbyte10 in_ST0;
  longdouble in_ST1;
  int iploc;
  int ipf;
  REAL *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int i;
  int in_stack_ffffffffffffffbc;
  undefined4 uVar2;
  undefined6 in_stack_ffffffffffffffc0;
  undefined6 uVar3;
  undefined2 in_stack_ffffffffffffffc6;
  
  i = in_ESI;
  TPZGaussRule::NInt(*(TPZGaussRule **)(in_RDI + 0x10));
  TPZGaussRule::NInt(*(TPZGaussRule **)(in_RDI + 0x10));
  TPZInt1Point::Point((TPZInt1Point *)CONCAT26(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc,
                      (TPZVec<double> *)CONCAT44(i,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8);
  TPZGaussRule::Loc((TPZGaussRule *)CONCAT44(in_stack_ffffffffffffffbc,in_ESI),i);
  uVar2 = (undefined4)in_ST0;
  uVar3 = (undefined6)((unkuint10)in_ST0 >> 0x20);
  pdVar1 = TPZVec<double>::operator[](in_RDX,0);
  *pdVar1 = (double)(longdouble)CONCAT64(uVar3,uVar2);
  TPZGaussRule::W((TPZGaussRule *)CONCAT44(uVar2,in_ESI),i);
  *in_RCX = (double)((longdouble)*in_RCX * in_ST1);
  return;
}

Assistant:

void Point(int ip, TPZVec<REAL> &pos, REAL &w) const override
    {
		int ipf = ip/fIntP->NInt();
		int iploc = ip%(fIntP->NInt());
		TFather::Point(ipf,pos,w);
		pos[Dim-1] = fIntP->Loc(iploc);
		w *= fIntP->W(iploc);
    }